

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StopThreadPololux(POLOLU *pPololu)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = PololuCS;
  lVar1 = 0;
  do {
    if (*(POLOLU **)((long)addrsPololu + lVar1 * 2) == pPololu) {
      *(undefined4 *)((long)bExitPololu + lVar1) = 1;
      WaitForThread(*(THREAD_IDENTIFIER *)((long)PololuThreadId + lVar1 * 2));
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resPololu + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadPololux(POLOLU* pPololu)
{
	int id = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitPololu[id] = TRUE;
	WaitForThread(PololuThreadId[id]);
	DeleteCriticalSection(&PololuCS[id]);
	resPololu[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}